

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O1

void __thiscall aiCamera::GetCameraMatrix(aiCamera *this,aiMatrix4x4 *out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar1 = (this->mLookAt).x;
  fVar2 = (this->mLookAt).y;
  fVar3 = (this->mLookAt).z;
  fVar10 = fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2;
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  fVar10 = 1.0 / fVar10;
  fVar4 = (this->mUp).x;
  fVar5 = (this->mUp).y;
  fVar6 = (this->mUp).z;
  fVar11 = fVar6 * fVar6 + fVar4 * fVar4 + fVar5 * fVar5;
  if (fVar11 < 0.0) {
    fVar11 = sqrtf(fVar11);
  }
  else {
    fVar11 = SQRT(fVar11);
  }
  fVar11 = 1.0 / fVar11;
  fVar12 = (this->mUp).x;
  fVar13 = (this->mUp).y;
  fVar14 = (this->mLookAt).z;
  fVar7 = (this->mUp).z;
  fVar8 = (this->mLookAt).y;
  fVar15 = fVar13 * fVar14 - fVar8 * fVar7;
  fVar9 = (this->mLookAt).x;
  fVar14 = fVar7 * fVar9 - fVar14 * fVar12;
  fVar13 = fVar12 * fVar8 - fVar9 * fVar13;
  fVar12 = fVar13 * fVar13 + fVar15 * fVar15 + fVar14 * fVar14;
  if (fVar12 < 0.0) {
    fVar12 = sqrtf(fVar12);
  }
  else {
    fVar12 = SQRT(fVar12);
  }
  fVar12 = 1.0 / fVar12;
  out->a4 = -((this->mPosition).z * fVar13 * fVar12 +
             (this->mPosition).x * fVar15 * fVar12 + (this->mPosition).y * fVar14 * fVar12);
  out->b4 = -((this->mPosition).z * fVar6 * fVar11 +
             (this->mPosition).x * fVar4 * fVar11 + (this->mPosition).y * fVar5 * fVar11);
  out->c4 = -((this->mPosition).z * fVar3 * fVar10 +
             (this->mPosition).x * fVar1 * fVar10 + (this->mPosition).y * fVar2 * fVar10);
  out->a1 = fVar15 * fVar12;
  out->a2 = fVar14 * fVar12;
  out->a3 = fVar13 * fVar12;
  out->b1 = fVar4 * fVar11;
  out->b2 = fVar5 * fVar11;
  out->b3 = fVar6 * fVar11;
  out->c1 = fVar1 * fVar10;
  out->c2 = fVar2 * fVar10;
  out->c3 = fVar3 * fVar10;
  out->d3 = 0.0;
  out->d4 = 1.0;
  out->d1 = 0.0;
  out->d2 = 0.0;
  return;
}

Assistant:

void GetCameraMatrix (aiMatrix4x4& out) const
    {
        /** todo: test ... should work, but i'm not absolutely sure */

        /** We don't know whether these vectors are already normalized ...*/
        aiVector3D zaxis = mLookAt;     zaxis.Normalize();
        aiVector3D yaxis = mUp;         yaxis.Normalize();
        aiVector3D xaxis = mUp^mLookAt; xaxis.Normalize();

        out.a4 = -(xaxis * mPosition);
        out.b4 = -(yaxis * mPosition);
        out.c4 = -(zaxis * mPosition);

        out.a1 = xaxis.x;
        out.a2 = xaxis.y;
        out.a3 = xaxis.z;

        out.b1 = yaxis.x;
        out.b2 = yaxis.y;
        out.b3 = yaxis.z;

        out.c1 = zaxis.x;
        out.c2 = zaxis.y;
        out.c3 = zaxis.z;

        out.d1 = out.d2 = out.d3 = 0.f;
        out.d4 = 1.f;
    }